

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O0

void __thiscall
xe::TestNode::TestNode(TestNode *this,TestGroup *parent,TestNodeType nodeType,char *name,char *desc)

{
  TestGroup *pTVar1;
  char *pcVar2;
  bool bVar3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  Error *this_01;
  allocator<char> local_159;
  value_type local_158;
  TestNode *local_138;
  undefined1 local_129;
  string local_128;
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  _Self local_80;
  allocator<char> local_71;
  key_type local_70;
  _Self local_50;
  allocator<char> local_45 [20];
  allocator<char> local_31;
  char *local_30;
  char *desc_local;
  char *name_local;
  TestGroup *pTStack_18;
  TestNodeType nodeType_local;
  TestGroup *parent_local;
  TestNode *this_local;
  
  this->_vptr_TestNode = (_func_int **)&PTR__TestNode_0018ce58;
  this->m_parent = parent;
  this->m_nodeType = nodeType;
  local_30 = desc;
  desc_local = name;
  name_local._4_4_ = nodeType;
  pTStack_18 = parent;
  parent_local = (TestGroup *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_name,name,&local_31);
  std::allocator<char>::~allocator(&local_31);
  pcVar2 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_description,pcVar2,local_45)
  ;
  std::allocator<char>::~allocator(local_45);
  pcVar2 = desc_local;
  if (this->m_parent != (TestGroup *)0x0) {
    this_00 = &pTStack_18->m_childNames;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar2,&local_71);
    local_50._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(this_00,&local_70);
    local_80._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&pTStack_18->m_childNames);
    bVar3 = std::operator!=(&local_50,&local_80);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    if (bVar3) {
      local_129 = 1;
      this_01 = (Error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"Duplicate node \'",&local_101);
      std::operator+(&local_e0,&local_100,desc_local);
      std::operator+(&local_c0,&local_e0,"\' in \'");
      getFullPath_abi_cxx11_(&local_128,&pTStack_18->super_TestNode);
      std::operator+(&local_a0,&local_c0,&local_128);
      Error::Error(this_01,&local_a0);
      local_129 = 0;
      __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
    }
    local_138 = this;
    std::vector<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>::push_back
              (&this->m_parent->m_children,&local_138);
    pcVar2 = desc_local;
    pTVar1 = this->m_parent;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,pcVar2,&local_159);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&pTVar1->m_childNames,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
  }
  return;
}

Assistant:

TestNode::TestNode (TestGroup* parent, TestNodeType nodeType, const char* name, const char* desc)
	: m_parent		(parent)
	, m_nodeType	(nodeType)
	, m_name		(name)
	, m_description	(desc)
{
	if (m_parent)
	{
		// Verify that the name is unique.
		if (parent->m_childNames.find(name) != parent->m_childNames.end())
			throw Error(std::string("Duplicate node '") + name + "' in '" + parent->getFullPath());

		m_parent->m_children.push_back(this);
		m_parent->m_childNames.insert(name);
	}
}